

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * flatbuffers::RemoveStringQuotes(string *__return_storage_ptr__,string *s)

{
  char cVar1;
  char *pcVar2;
  
  if (1 < s->_M_string_length) {
    pcVar2 = (s->_M_dataplus)._M_p;
    cVar1 = *pcVar2;
    if (((cVar1 == '\'') || (cVar1 == '\"')) && (cVar1 == pcVar2[s->_M_string_length - 1])) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

std::string RemoveStringQuotes(const std::string &s) {
  auto ch = *s.c_str();
  return ((s.size() >= 2) && (ch == '\"' || ch == '\'') && (ch == s.back()))
             ? s.substr(1, s.length() - 2)
             : s;
}